

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile.c
# Opt level: O3

FILE * tmpfile(void)

{
  int __fd;
  int __fd_00;
  uint uVar1;
  char *__s;
  FILE *pFVar2;
  uint random;
  uint local_2c;
  
  pFVar2 = (FILE *)0x0;
  __fd = open("/dev/urandom",0);
  __s = (char *)malloc(0x2e);
  if (__fd != -1) {
    read(__fd,&local_2c,4);
    sprintf(__s,"/tmp/%u.tmp",(ulong)local_2c);
    __fd_00 = open(__s,0xc2,0x180);
    if (__fd_00 == -1) {
      do {
        close(-1);
        read(__fd,&local_2c,4);
        sprintf(__s,"/tmp/%u.tmp",(ulong)local_2c);
        __fd_00 = open(__s,0xc2,0x180);
      } while (__fd_00 == -1);
    }
    close(__fd);
    pFVar2 = (FILE *)_PDCLIB_init_file_t((_PDCLIB_file_t *)0x0);
    if (pFVar2 == (FILE *)0x0) {
      close(__fd_00);
      pFVar2 = (FILE *)0x0;
    }
    else {
      uVar1 = _PDCLIB_filemode("wb+");
      *(uint *)((long)&pFVar2->_IO_buf_end + 4) =
           uVar1 | *(uint *)((long)&pFVar2->_IO_buf_end + 4) | 0x2002;
      pFVar2->_flags = __fd_00;
      *(char **)&pFVar2->_fileno = __s;
      mtx_lock(&_PDCLIB_filelist_mtx);
      pFVar2->_old_offset = (__off_t)_PDCLIB_filelist;
      _PDCLIB_filelist = (_PDCLIB_file_t *)pFVar2;
      mtx_unlock(&_PDCLIB_filelist_mtx);
    }
  }
  return pFVar2;
}

Assistant:

struct _PDCLIB_file_t * tmpfile( void )
{
    FILE * rc;
    /* This is the chosen way to get high-quality randomness. Replace as
       appropriate.
    */
    int randomsource = open( "/dev/urandom", O_RDONLY );
    /* Working under the assumption that the tempfile location is canonical
       (absolute), and does not require going through _PDCLIB_realpath().
    */
    char * filename = ( char * )malloc( L_tmpnam );
    _PDCLIB_fd_t fd;

    if ( randomsource == -1 )
    {
        return NULL;
    }

    for ( ;; )
    {
        /* Get a filename candidate. What constitutes a valid filename and
           where temporary files are usually located is platform-dependent,
           which is one reason why this function is located in the platform
           overlay. The other reason is that a *good* implementation should
           use high-quality randomness instead of a pseudo-random sequence to
           generate the filename candidate, which is *also* platform-dependent.
        */
        unsigned int random;
        read( randomsource, (void *)&random, sizeof( unsigned int ) );
        sprintf( filename, "/tmp/%u.tmp", random );
        /* Check if file of this name exists. Note that fopen() is a very weak
           check, which does not take e.g. access permissions into account
           (file might exist but not readable). Replace with something more
           appropriate.
        */
        fd = open( filename, O_CREAT | O_EXCL | O_RDWR, S_IRUSR | S_IWUSR );

        if ( fd != -1 )
        {
            /* Found a file that does not exist yet */
            break;
        }

        close( fd );
    }

    close( randomsource );

    /* See fopen(), which does much of the same. */

    if ( ( rc = _PDCLIB_init_file_t( NULL ) ) == NULL )
    {
        /* initializing FILE structure failed */
        close( fd );
        return NULL;
    }

    rc->status |= _PDCLIB_filemode( "wb+" ) | _IOLBF | _PDCLIB_DELONCLOSE;
    rc->handle = fd;

    /* Filename (for potential freopen()) */
    rc->filename = filename;

    /* Adding to list of open files */
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
    rc->next = _PDCLIB_filelist;
    _PDCLIB_filelist = rc;
    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return rc;
}